

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uc.c
# Opt level: O3

uc_err uc_query(uc_engine *uc,uc_query_type type,size_t *result)

{
  uc_err uVar1;
  ulong uVar2;
  
  if ((uc->init_done != false) || (uVar1 = uc_init_engine(uc), uVar1 == UC_ERR_OK)) {
    switch(type) {
    case UC_QUERY_MODE:
      if (uc->arch == UC_ARCH_ARM) {
        uVar1 = (*uc->query)(uc,UC_QUERY_MODE,result);
        return uVar1;
      }
      uVar2 = (ulong)uc->mode;
      break;
    case UC_QUERY_PAGE_SIZE:
      uVar2 = (ulong)uc->target_page_size;
      break;
    case UC_QUERY_ARCH:
      uVar2 = (ulong)uc->arch;
      break;
    case UC_QUERY_TIMEOUT:
      uVar2 = (ulong)uc->timed_out;
      break;
    default:
      return UC_ERR_ARG;
    }
    *result = uVar2;
    uVar1 = UC_ERR_OK;
  }
  return uVar1;
}

Assistant:

UNICORN_EXPORT
uc_err uc_query(uc_engine *uc, uc_query_type type, size_t *result)
{
    UC_INIT(uc);

    switch (type) {
    default:
        return UC_ERR_ARG;

    case UC_QUERY_PAGE_SIZE:
        *result = uc->target_page_size;
        break;

    case UC_QUERY_ARCH:
        *result = uc->arch;
        break;

    case UC_QUERY_MODE:
#ifdef UNICORN_HAS_ARM
        if (uc->arch == UC_ARCH_ARM) {
            return uc->query(uc, type, result);
        }
#endif
        *result = uc->mode;
        break;

    case UC_QUERY_TIMEOUT:
        *result = uc->timed_out;
        break;
    }

    return UC_ERR_OK;
}